

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<double>,testing::Matcher<double>>,std::tuple<double,double>>
               (tuple<testing::Matcher<double>,_testing::Matcher<double>_> *matchers,
               tuple<double,_double> *values,ostream *os)

{
  double dVar1;
  MatcherInterface<double> *pMVar2;
  char cVar3;
  ostream *poVar4;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<double> local_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<double>::Matcher
            ((Matcher<double> *)&local_1e8,
             &(matchers->super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>
              ).super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl);
  dVar1 = (values->super__Tuple_impl<0UL,_double,_double>).super__Head_base<0UL,_double,_false>.
          _M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  cVar3 = (**(code **)(*(long *)local_1e8.impl_.value_ + 0x20))
                    (dVar1,local_1e8.impl_.value_,&local_1b0);
  if (cVar3 == '\0') {
    poVar4 = std::operator<<(os,"  Expected arg #");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,": ");
    pMVar2 = (matchers->super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>)
             .super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl.
             super_MatcherBase<double>.impl_.value_;
    (**(code **)(*(long *)pMVar2 + 0x10))(pMVar2,os);
    std::operator<<(os,"\n           Actual: ");
    std::ostream::_M_insert<double>(dVar1);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<double>::~MatcherBase(&local_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }